

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

void __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::splitByGeometry(BuilderT<embree::NodeRefPtr<4>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox<embree::Vec3fx> *pBVar1;
  Vec3fx *pVVar2;
  BBox1f BVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  float fVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  PrimRefMB *pPVar11;
  PrimRefVector pmVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  PrimRefMB *pPVar21;
  unsigned_long uVar22;
  size_t sVar23;
  undefined4 uVar24;
  ulong uVar25;
  undefined4 uVar26;
  ulong uVar27;
  size_t sVar28;
  undefined4 uVar29;
  undefined3 uVar30;
  undefined4 in_register_0000009c;
  ulong uVar31;
  PrimRefMB *pPVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  Vec3fa center;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  
  uVar9 = (set->super_PrimInfoMB).object_range._begin;
  uVar10 = (set->super_PrimInfoMB).object_range._end;
  pPVar11 = set->prims->items;
  uVar25 = uVar9 * 0x50;
  pPVar21 = pPVar11 + uVar9;
  fVar8 = pPVar11[uVar9].lbounds.bounds0.lower.field_0.m128[3];
  pPVar32 = pPVar11 + uVar10;
  auVar46 = ZEXT464(0x3f800000);
  auVar34 = ZEXT816(0x3f80000000000000);
  auVar44._8_4_ = 0x7f800000;
  auVar44._0_8_ = 0x7f8000007f800000;
  auVar44._12_4_ = 0x7f800000;
  auVar43._8_4_ = 0xff800000;
  auVar43._0_8_ = 0xff800000ff800000;
  auVar43._12_4_ = 0xff800000;
  uVar27 = 0;
  sVar28 = 0;
  sVar23 = 0;
  uVar31 = 0;
  auVar45 = auVar46._0_16_;
  auVar38 = auVar43;
  auVar15 = auVar44;
  auVar13 = auVar43;
  auVar14 = auVar44;
  local_e8 = auVar34;
  local_d8 = auVar44;
  local_c8 = auVar43;
  local_b8 = auVar44;
  local_a8 = auVar43;
  local_98 = auVar44;
  local_88 = auVar43;
  do {
    pPVar32 = pPVar32 + -1;
    while ((auVar39 = auVar46._0_16_, pPVar21 <= pPVar32 &&
           ((pPVar21->lbounds).bounds0.lower.field_0.m128[3] == fVar8))) {
      aVar4 = (pPVar21->lbounds).bounds0.lower.field_0.field_1;
      aVar5 = (pPVar21->lbounds).bounds0.upper.field_0.field_1;
      aVar6 = (pPVar21->lbounds).bounds1.lower.field_0.field_1;
      aVar7 = (pPVar21->lbounds).bounds1.upper.field_0.field_1;
      auVar36._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
      auVar36._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
      auVar36._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
      auVar36._12_4_ =
           aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
           aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
      auVar14 = vminps_avx(auVar14,(undefined1  [16])aVar4);
      auVar13 = vmaxps_avx(auVar13,(undefined1  [16])aVar5);
      auVar15 = vminps_avx(auVar15,(undefined1  [16])aVar6);
      auVar38 = vmaxps_avx(auVar38,(undefined1  [16])aVar7);
      auVar44 = vminps_avx(auVar44,auVar36);
      auVar43 = vmaxps_avx(auVar43,auVar36);
      auVar35._8_8_ = 0;
      auVar35._0_4_ = (pPVar21->time_range).lower;
      auVar35._4_4_ = (pPVar21->time_range).upper;
      auVar36 = vcmpps_avx(auVar39,auVar35,1);
      auVar40 = vinsertps_avx(auVar39,auVar35,0x50);
      auVar39 = vblendps_avx(auVar35,auVar39,2);
      auVar39 = vblendvps_avx(auVar39,auVar40,auVar36);
      auVar46 = ZEXT1664(auVar39);
      uVar26 = (undefined4)(uVar25 >> 0x20);
      uVar24 = vextractps_avx((undefined1  [16])aVar6,3);
      sVar23 = sVar23 + CONCAT44(uVar26,uVar24);
      uVar24 = vextractps_avx((undefined1  [16])aVar7,3);
      uVar25 = CONCAT44(uVar26,uVar24);
      bVar33 = uVar31 < uVar25;
      if (uVar31 <= uVar25) {
        uVar31 = uVar25;
      }
      uVar25 = CONCAT71((int7)(uVar25 >> 8),bVar33);
      auVar39 = vpshufd_avx(ZEXT416((uint)uVar25),0x50);
      auVar39 = vpslld_avx(auVar39,0x1f);
      auVar34 = vblendvps_avx(auVar34,auVar35,auVar39);
      pPVar21 = pPVar21 + 1;
    }
    while( true ) {
      if (pPVar32 < pPVar21) {
        uVar22 = ((long)pPVar21 - (long)pPVar11) / 0x50;
        auVar37._8_8_ = 0;
        auVar37._0_4_ = (set->super_PrimInfoMB).time_range.lower;
        auVar37._4_4_ = (set->super_PrimInfoMB).time_range.upper;
        auVar40 = vcmpps_avx(auVar39,auVar37,1);
        auVar36 = vblendps_avx(auVar37,auVar39,2);
        auVar39 = vinsertps_avx(auVar39,auVar37,0x50);
        auVar39 = vblendvps_avx(auVar39,auVar36,auVar40);
        pmVar12 = set->prims;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
         lower.field_0.m128 = auVar14;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
         upper.field_0.m128 = auVar13;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
         lower.field_0.m128 = auVar15;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
         upper.field_0.m128 = auVar38;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
         field_0.m128 = auVar44;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
         field_0.m128 = auVar43;
        (lset->super_PrimInfoMB).num_time_segments = sVar23;
        (lset->super_PrimInfoMB).max_num_time_segments = uVar31;
        auVar34 = vmovlhps_avx(auVar34,auVar39);
        (lset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar34._0_8_;
        (lset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar34._0_8_ >> 0x20);
        (lset->super_PrimInfoMB).time_range.lower = (float)(int)auVar34._8_8_;
        (lset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar34._8_8_ >> 0x20);
        lset->prims = pmVar12;
        (lset->super_PrimInfoMB).object_range._begin = uVar9;
        (lset->super_PrimInfoMB).object_range._end = uVar22;
        auVar38._8_8_ = 0;
        auVar38._0_4_ = (set->super_PrimInfoMB).time_range.lower;
        auVar38._4_4_ = (set->super_PrimInfoMB).time_range.upper;
        auVar13 = vcmpps_avx(auVar45,auVar38,1);
        auVar34 = vblendps_avx(auVar38,auVar45,2);
        auVar45 = vinsertps_avx(auVar45,auVar38,0x50);
        auVar45 = vblendvps_avx(auVar45,auVar34,auVar13);
        pmVar12 = set->prims;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
          .lower.field_0 = local_d8._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds0.lower.field_0 + 8) = local_d8._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
          .upper.field_0 = local_c8._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds0.upper.field_0 + 8) = local_c8._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
          .lower.field_0 = local_b8._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds1.lower.field_0 + 8) = local_b8._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
          .upper.field_0 = local_a8._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds1.upper.field_0 + 8) = local_a8._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
          field_0 = local_98._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                 lower.field_0 + 8) = local_98._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
          field_0 = local_88._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                 upper.field_0 + 8) = local_88._8_8_;
        auVar45 = vmovlhps_avx(local_e8,auVar45);
        (rset->super_PrimInfoMB).num_time_segments = sVar28;
        (rset->super_PrimInfoMB).max_num_time_segments = uVar27;
        (rset->super_PrimInfoMB).max_time_range.lower = (float)(int)auVar45._0_8_;
        (rset->super_PrimInfoMB).max_time_range.upper = (float)(int)((ulong)auVar45._0_8_ >> 0x20);
        (rset->super_PrimInfoMB).time_range.lower = (float)(int)auVar45._8_8_;
        (rset->super_PrimInfoMB).time_range.upper = (float)(int)((ulong)auVar45._8_8_ >> 0x20);
        rset->prims = pmVar12;
        (rset->super_PrimInfoMB).object_range._begin = uVar22;
        (rset->super_PrimInfoMB).object_range._end = uVar10;
        return;
      }
      aVar4 = (pPVar32->lbounds).bounds0.lower.field_0.field_1;
      aVar5 = (pPVar32->lbounds).bounds0.upper.field_0.field_1;
      aVar6 = (pPVar32->lbounds).bounds1.lower.field_0.field_1;
      aVar7 = (pPVar32->lbounds).bounds1.upper.field_0.field_1;
      auVar40._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar5.x * 0.5 + aVar7.x * 0.5;
      auVar40._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar5.y * 0.5 + aVar7.y * 0.5;
      auVar40._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar5.z * 0.5 + aVar7.z * 0.5;
      auVar40._12_4_ =
           aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
           aVar5.field_3.w * 0.5 + aVar7.field_3.w * 0.5;
      auVar42._8_8_ = 0;
      auVar42._0_4_ = (pPVar32->time_range).lower;
      auVar42._4_4_ = (pPVar32->time_range).upper;
      uVar29 = vextractps_avx((undefined1  [16])aVar6,3);
      uVar26 = (undefined4)(uVar25 >> 0x20);
      uVar24 = vextractps_avx((undefined1  [16])aVar7,3);
      uVar25 = CONCAT44(uVar26,uVar24);
      uVar30 = (undefined3)((uint)uVar29 >> 8);
      if ((pPVar32->lbounds).bounds0.lower.field_0.m128[3] == fVar8) break;
      local_d8 = vminps_avx(local_d8,(undefined1  [16])aVar4);
      local_c8 = vmaxps_avx(local_c8,(undefined1  [16])aVar5);
      local_b8 = vminps_avx(local_b8,(undefined1  [16])aVar6);
      local_a8 = vmaxps_avx(local_a8,(undefined1  [16])aVar7);
      auVar35 = vcmpps_avx(auVar45,auVar42,1);
      auVar36 = vblendps_avx(auVar45,auVar42,2);
      auVar45 = vblendps_avx(auVar42,auVar45,2);
      auVar45 = vblendvps_avx(auVar45,auVar36,auVar35);
      sVar28 = sVar28 + CONCAT44(in_register_0000009c,uVar29);
      auVar36 = vpshufd_avx(ZEXT416(CONCAT31(uVar30,uVar27 < uVar25)),0x50);
      auVar36 = vpslld_avx(auVar36,0x1f);
      local_e8 = vblendvps_avx(local_e8,auVar42,auVar36);
      local_98 = vminps_avx(local_98,auVar40);
      if (uVar27 <= uVar25) {
        uVar27 = uVar25;
      }
      local_88 = vmaxps_avx(local_88,auVar40);
      pPVar32 = pPVar32 + -1;
    }
    auVar13 = vmaxps_avx(auVar13,(undefined1  [16])aVar5);
    auVar15 = vminps_avx(auVar15,(undefined1  [16])aVar6);
    auVar38 = vmaxps_avx(auVar38,(undefined1  [16])aVar7);
    auVar44 = vminps_avx(auVar44,auVar40);
    auVar35 = vcmpps_avx(auVar39,auVar42,1);
    auVar36 = vblendps_avx(auVar39,auVar42,2);
    auVar39 = vblendps_avx(auVar42,auVar39,2);
    auVar39 = vblendvps_avx(auVar39,auVar36,auVar35);
    auVar46 = ZEXT1664(auVar39);
    sVar23 = sVar23 + CONCAT44(in_register_0000009c,uVar29);
    auVar39 = vpshufd_avx(ZEXT416(CONCAT31(uVar30,uVar31 < uVar25)),0x50);
    auVar39 = vpslld_avx(auVar39,0x1f);
    auVar34 = vblendvps_avx(auVar34,auVar42,auVar39);
    auVar43 = vmaxps_avx(auVar43,auVar40);
    aVar20 = (pPVar21->lbounds).bounds0.lower.field_0;
    aVar5 = (pPVar21->lbounds).bounds0.upper.field_0.field_1;
    pBVar1 = &(pPVar21->lbounds).bounds1;
    aVar19 = (pBVar1->lower).field_0;
    pVVar2 = &(pPVar21->lbounds).bounds1.upper;
    uVar16 = *(undefined8 *)&pVVar2->field_0;
    uVar17 = *(undefined8 *)((long)&(pPVar21->lbounds).bounds1.upper.field_0 + 8);
    aVar18 = pVVar2->field_0;
    BVar3 = pPVar21->time_range;
    auVar41._8_8_ = 0;
    auVar41._0_4_ = BVar3.lower;
    auVar41._4_4_ = BVar3.upper;
    auVar39 = vcmpps_avx(auVar45,auVar41,1);
    auVar36 = vinsertps_avx(auVar45,auVar41,0x50);
    auVar45 = vblendps_avx(auVar41,auVar45,2);
    auVar45 = vblendvps_avx(auVar45,auVar36,auVar39);
    if (uVar31 <= uVar25) {
      uVar31 = uVar25;
    }
    auVar39._0_4_ =
         (pPVar21->lbounds).bounds0.lower.field_0.m128[0] * 0.5 +
         (pBVar1->lower).field_0.m128[0] * 0.5 + aVar5.x * 0.5 + (float)uVar16 * 0.5;
    auVar39._4_4_ =
         (pPVar21->lbounds).bounds0.lower.field_0.m128[1] * 0.5 +
         (pPVar21->lbounds).bounds1.lower.field_0.m128[1] * 0.5 +
         aVar5.y * 0.5 + (float)((ulong)uVar16 >> 0x20) * 0.5;
    auVar39._8_4_ =
         (pPVar21->lbounds).bounds0.lower.field_0.m128[2] * 0.5 +
         (pPVar21->lbounds).bounds1.lower.field_0.m128[2] * 0.5 +
         aVar5.z * 0.5 + (float)uVar17 * 0.5;
    auVar39._12_4_ =
         (pPVar21->lbounds).bounds0.lower.field_0.m128[3] * 0.5 +
         (pPVar21->lbounds).bounds1.lower.field_0.m128[3] * 0.5 +
         aVar5.field_3.w * 0.5 + (float)((ulong)uVar17 >> 0x20) * 0.5;
    local_98 = vminps_avx(local_98,auVar39);
    uVar24 = vextractps_avx((undefined1  [16])aVar19,3);
    local_88 = vmaxps_avx(local_88,auVar39);
    sVar28 = sVar28 + CONCAT44(uVar26,uVar24);
    uVar24 = vextractps_avx((undefined1  [16])aVar18,3);
    uVar25 = CONCAT44(uVar26,uVar24);
    auVar39 = vpshufd_avx(ZEXT416(CONCAT31(uVar30,uVar27 < uVar25)),0x50);
    auVar39 = vpslld_avx(auVar39,0x1f);
    local_e8 = vblendvps_avx(local_e8,auVar41,auVar39);
    auVar14 = vminps_avx(auVar14,(undefined1  [16])aVar4);
    (pPVar21->lbounds).bounds0.lower.field_0.field_1 = aVar4;
    uVar16 = *(undefined8 *)((long)&(pPVar32->lbounds).bounds0.upper.field_0 + 8);
    *(undefined8 *)&(pPVar21->lbounds).bounds0.upper.field_0 =
         *(undefined8 *)&(pPVar32->lbounds).bounds0.upper.field_0;
    *(undefined8 *)((long)&(pPVar21->lbounds).bounds0.upper.field_0 + 8) = uVar16;
    uVar16 = *(undefined8 *)((long)&(pPVar32->lbounds).bounds1.lower.field_0 + 8);
    *(undefined8 *)&(pPVar21->lbounds).bounds1.lower.field_0 =
         *(undefined8 *)&(pPVar32->lbounds).bounds1.lower.field_0;
    *(undefined8 *)((long)&(pPVar21->lbounds).bounds1.lower.field_0 + 8) = uVar16;
    uVar16 = *(undefined8 *)((long)&(pPVar32->lbounds).bounds1.upper.field_0 + 8);
    *(undefined8 *)&(pPVar21->lbounds).bounds1.upper.field_0 =
         *(undefined8 *)&(pPVar32->lbounds).bounds1.upper.field_0;
    *(undefined8 *)((long)&(pPVar21->lbounds).bounds1.upper.field_0 + 8) = uVar16;
    (pPVar21->time_range).lower = (pPVar32->time_range).lower;
    (pPVar21->time_range).upper = (pPVar32->time_range).upper;
    local_d8 = vminps_avx(local_d8,(undefined1  [16])aVar20);
    (pPVar32->lbounds).bounds0.lower.field_0 = aVar20;
    local_c8 = vmaxps_avx(local_c8,(undefined1  [16])aVar5);
    (pPVar32->lbounds).bounds0.upper.field_0.field_1 = aVar5;
    local_b8 = vminps_avx(local_b8,(undefined1  [16])aVar19);
    (pPVar32->lbounds).bounds1.lower.field_0 = aVar19;
    local_a8 = vmaxps_avx(local_a8,(undefined1  [16])aVar18);
    (pPVar32->lbounds).bounds1.upper.field_0 = aVar18;
    pPVar32->time_range = BVar3;
    if (uVar27 <= uVar25) {
      uVar27 = uVar25;
    }
    pPVar21 = pPVar21 + 1;
  } while( true );
}

Assistant:

void splitByGeometry(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            assert(set.size() > 1);

            mvector<PrimRefMB>& prims = *set.prims;
            const size_t begin = set.begin();
            const size_t end   = set.end();
            
            PrimInfoMB left(empty);
            PrimInfoMB right(empty);
            unsigned int geomID = prims[begin].geomID();
            size_t center = serial_partitioning(prims.data(),begin,end,left,right,
                                                [&] ( const PrimRefMB& prim ) { return prim.geomID() == geomID; },
                                                [ ] ( PrimInfoMB& dst, const PrimRefMB& prim ) { dst.add_primref(prim); });
            
            new (&lset) SetMB(left, set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(right,set.prims,range<size_t>(center,end  ),set.time_range);
          }